

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactor.h
# Opt level: O0

HFactor * __thiscall HFactor::operator=(HFactor *this,HFactor *param_2)

{
  HVectorBase<double> *in_RSI;
  HFactor *in_RDI;
  vector<char,_std::allocator<char>_> *unaff_retaddr;
  HFactor *__x;
  
  in_RDI->build_realTick = *(double *)in_RSI;
  in_RDI->build_synthetic_tick =
       (double)(in_RSI->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
  in_RDI->rank_deficiency =
       *(HighsInt *)
        &(in_RSI->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
  __x = in_RDI;
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)unaff_retaddr,
             (vector<int,_std::allocator<int>_> *)in_RDI);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)unaff_retaddr,
             (vector<int,_std::allocator<int>_> *)__x);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)unaff_retaddr,
             (vector<int,_std::allocator<int>_> *)__x);
  RefactorInfo::operator=((RefactorInfo *)in_RSI,(RefactorInfo *)in_RDI);
  memcpy(&in_RDI->basis_matrix_num_el,&in_RSI[1].index,0x70);
  std::unique_ptr<HFactor::LogData,_std::default_delete<HFactor::LogData>_>::operator=
            ((unique_ptr<HFactor::LogData,_std::default_delete<HFactor::LogData>_> *)in_RSI,
             (unique_ptr<HFactor::LogData,_std::default_delete<HFactor::LogData>_> *)in_RDI);
  HighsLogOptions::operator=((HighsLogOptions *)in_RSI,(HighsLogOptions *)in_RDI);
  *(pointer *)&in_RDI->use_original_HFactor_logic =
       in_RSI[2].array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  *(double *)&in_RDI->update_method = in_RSI[2].synthetic_tick;
  in_RDI->build_timer_ =
       *(HighsTimer **)&in_RSI[2].cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl;
  in_RDI->nwork =
       *(HighsInt *)
        &in_RSI[2].cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x8;
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)unaff_retaddr,
             (vector<int,_std::allocator<int>_> *)__x);
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)unaff_retaddr,
             (vector<double,_std::allocator<double>_> *)__x);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)unaff_retaddr,
             (vector<int,_std::allocator<int>_> *)__x);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)unaff_retaddr,
             (vector<int,_std::allocator<int>_> *)__x);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)unaff_retaddr,
             (vector<int,_std::allocator<int>_> *)__x);
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)unaff_retaddr,
             (vector<double,_std::allocator<double>_> *)__x);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)unaff_retaddr,
             (vector<int,_std::allocator<int>_> *)__x);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)unaff_retaddr,
             (vector<int,_std::allocator<int>_> *)__x);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)unaff_retaddr,
             (vector<int,_std::allocator<int>_> *)__x);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)unaff_retaddr,
             (vector<int,_std::allocator<int>_> *)__x);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)unaff_retaddr,
             (vector<int,_std::allocator<int>_> *)__x);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)unaff_retaddr,
             (vector<int,_std::allocator<int>_> *)__x);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)unaff_retaddr,
             (vector<int,_std::allocator<int>_> *)__x);
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)unaff_retaddr,
             (vector<double,_std::allocator<double>_> *)__x);
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)unaff_retaddr,
             (vector<double,_std::allocator<double>_> *)__x);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)unaff_retaddr,
             (vector<int,_std::allocator<int>_> *)__x);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)unaff_retaddr,
             (vector<int,_std::allocator<int>_> *)__x);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)unaff_retaddr,
             (vector<int,_std::allocator<int>_> *)__x);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)unaff_retaddr,
             (vector<int,_std::allocator<int>_> *)__x);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)unaff_retaddr,
             (vector<int,_std::allocator<int>_> *)__x);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)unaff_retaddr,
             (vector<int,_std::allocator<int>_> *)__x);
  std::vector<char,_std::allocator<char>_>::operator=
            (unaff_retaddr,(vector<char,_std::allocator<char>_> *)__x);
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)unaff_retaddr,
             (vector<double,_std::allocator<double>_> *)__x);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)unaff_retaddr,
             (vector<int,_std::allocator<int>_> *)__x);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)unaff_retaddr,
             (vector<int,_std::allocator<int>_> *)__x);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)unaff_retaddr,
             (vector<int,_std::allocator<int>_> *)__x);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)unaff_retaddr,
             (vector<int,_std::allocator<int>_> *)__x);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)unaff_retaddr,
             (vector<int,_std::allocator<int>_> *)__x);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)unaff_retaddr,
             (vector<int,_std::allocator<int>_> *)__x);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)unaff_retaddr,
             (vector<int,_std::allocator<int>_> *)__x);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)unaff_retaddr,
             (vector<int,_std::allocator<int>_> *)__x);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)unaff_retaddr,
             (vector<int,_std::allocator<int>_> *)__x);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)unaff_retaddr,
             (vector<int,_std::allocator<int>_> *)__x);
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)unaff_retaddr,
             (vector<double,_std::allocator<double>_> *)__x);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)unaff_retaddr,
             (vector<int,_std::allocator<int>_> *)__x);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)unaff_retaddr,
             (vector<int,_std::allocator<int>_> *)__x);
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)unaff_retaddr,
             (vector<double,_std::allocator<double>_> *)__x);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)unaff_retaddr,
             (vector<int,_std::allocator<int>_> *)__x);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)unaff_retaddr,
             (vector<int,_std::allocator<int>_> *)__x);
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)unaff_retaddr,
             (vector<double,_std::allocator<double>_> *)__x);
  *(pointer *)&in_RDI->u_merit_x =
       in_RSI[7].packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)unaff_retaddr,
             (vector<int,_std::allocator<int>_> *)__x);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)unaff_retaddr,
             (vector<int,_std::allocator<int>_> *)__x);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)unaff_retaddr,
             (vector<int,_std::allocator<int>_> *)__x);
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)unaff_retaddr,
             (vector<double,_std::allocator<double>_> *)__x);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)unaff_retaddr,
             (vector<int,_std::allocator<int>_> *)__x);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)unaff_retaddr,
             (vector<int,_std::allocator<int>_> *)__x);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)unaff_retaddr,
             (vector<int,_std::allocator<int>_> *)__x);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)unaff_retaddr,
             (vector<int,_std::allocator<int>_> *)__x);
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)unaff_retaddr,
             (vector<double,_std::allocator<double>_> *)__x);
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)unaff_retaddr,
             (vector<double,_std::allocator<double>_> *)__x);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)unaff_retaddr,
             (vector<int,_std::allocator<int>_> *)__x);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)unaff_retaddr,
             (vector<int,_std::allocator<int>_> *)__x);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)unaff_retaddr,
             (vector<int,_std::allocator<int>_> *)__x);
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)unaff_retaddr,
             (vector<double,_std::allocator<double>_> *)__x);
  HVectorBase<double>::operator=(in_RSI,(HVectorBase<double> *)in_RDI);
  return in_RDI;
}

Assistant:

HFactor()
      : build_realTick(0.0),
        build_synthetic_tick(0.0),
        rank_deficiency(0),
        basis_matrix_num_el(0),
        invert_num_el(0),
        kernel_dim(0),
        kernel_num_el(0),
        num_row(0),
        num_col(0),
        num_basic(0),
        a_matrix_valid(false),
        a_start(nullptr),
        a_index(nullptr),
        a_value(nullptr),
        basic_index(nullptr),
        pivot_threshold(0.0),
        pivot_tolerance(0.0),
        highs_debug_level(0),
        time_limit_(0.0),
        use_original_HFactor_logic(false),
        debug_report_(false),
        basis_matrix_limit_size(0),
        update_method(0),
        build_timer_(nullptr),
        nwork(0),
        u_merit_x(0),
        // clang-format off
        u_total_x(0) {}